

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O3

void __thiscall
Fade::mergeCategoricalValues
          (Fade *this,vector<double,_std::allocator<double>_> *out,int *outOffsets,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *in,vector<int_*,_std::allocator<int_*>_> *inOffsets)

{
  void *__src;
  iterator iVar1;
  vector<double,std::allocator<double>> *this_00;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double *pdVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  pointer ppiVar15;
  int *piVar16;
  int *__s;
  double *pdVar17;
  ulong uVar18;
  pointer pvVar19;
  uint uVar20;
  double *pdVar21;
  double dVar22;
  double dVar23;
  int aiStack_100 [2];
  double adStack_f8 [2];
  ulong local_e8;
  vector<double,std::allocator<double>> *local_e0;
  vector<int_*,_std::allocator<int_*>_> *local_d8;
  int *local_d0;
  Fade *local_c8;
  long local_c0;
  long local_b8;
  double local_b0;
  pointer local_a8;
  pointer local_a0;
  double *local_98;
  long local_90;
  int local_88;
  uint local_84;
  double local_80;
  double agg;
  ulong local_70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_68;
  long local_60;
  int *local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  uint local_34;
  
  lVar3 = (long)((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
                ->_id;
  lVar7 = (long)this->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 2 + lVar3];
  local_b8 = (long)this->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 3 + lVar3];
  local_70 = ((long)(in->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(in->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  pdVar21 = adStack_f8 + dfdb::params::DEGREE_OF_INTERACTIONS * -2;
  pdVar17 = pdVar21 + dfdb::params::DEGREE_OF_INTERACTIONS * -2;
  iVar4 = (int)local_70;
  __s = (int *)((long)pdVar17 - ((local_70 & 0xffffffff) * 4 + 0xf & 0xfffffffffffffff0));
  local_d8 = inOffsets;
  local_d0 = outOffsets;
  local_c8 = this;
  local_68 = in;
  __s[-2] = 0x12d31d;
  __s[-1] = 0;
  memset(__s,0,(long)iVar4 << 2);
  local_c0 = lVar7;
  if (0 < lVar7) {
    uVar8 = (ulong)((uint)local_70 & 0x7fffffff);
    local_48 = 0;
    agg = (double)pdVar17;
    local_58 = __s;
    local_50 = uVar8;
    local_e0 = (vector<double,std::allocator<double>> *)out;
    local_98 = pdVar21;
    piVar16 = __s;
    do {
      uVar20 = local_c8->_degreeOfCategoricalAggregateGroup[local_48 + local_b8];
      local_90 = (long)(int)uVar20;
      if (0 < (long)(int)uVar20) {
        iVar4 = *piVar16;
        lVar3 = *(long *)&(((local_68->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data;
        uVar5 = 0;
        do {
          pdVar21[uVar5] = *(double *)((long)iVar4 * 8 + lVar3 + uVar5 * 8);
          pdVar17[uVar5] = 1.79769313486232e+308;
          uVar5 = uVar5 + 1;
        } while (uVar20 != uVar5);
      }
      lVar3 = local_90;
      local_40 = (ulong)uVar20;
      if (1 < (int)local_70) {
        pvVar19 = (local_68->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar5 = 1;
        do {
          if (0 < (int)local_40) {
            lVar6 = (long)piVar16[uVar5] * 8 +
                    *(long *)&pvVar19[uVar5].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data;
            lVar13 = 0;
            uVar9 = local_40;
            pdVar11 = pdVar21;
            lVar7 = lVar6;
            do {
              dVar22 = *(double *)(lVar6 + lVar13 * 8);
              dVar23 = pdVar21[lVar13];
              if (dVar22 < dVar23) {
                uVar14 = 0;
                do {
                  pdVar11[uVar14] = *(double *)(lVar7 + uVar14 * 8);
                  uVar14 = uVar14 + 1;
                } while (uVar9 != uVar14);
                dVar22 = *(double *)(lVar6 + lVar13 * 8);
                dVar23 = pdVar21[lVar13];
              }
              if (dVar23 < dVar22) break;
              lVar13 = lVar13 + 1;
              lVar7 = lVar7 + 8;
              pdVar11 = pdVar11 + 1;
              uVar9 = uVar9 - 1;
            } while (lVar13 < lVar3);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar8);
      }
      local_88 = (int)local_40 + 1;
      local_84 = (int)lVar3 - 1;
      uVar5 = local_40;
      do {
        local_80 = 0.0;
        if ((int)local_70 < 1) {
          local_34 = 0;
        }
        else {
          ppiVar15 = (local_d8->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          pvVar19 = (local_68->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_b0 = 0.0;
          uVar14 = 0;
          uVar9 = 0;
          local_a8 = ppiVar15;
          local_a0 = pvVar19;
          lVar3 = local_48;
          do {
            uVar20 = piVar16[uVar14];
            uVar18 = (ulong)uVar20;
            iVar4 = ppiVar15[uVar14][lVar3];
            if ((int)uVar20 < iVar4) {
              local_60 = *(long *)&pvVar19[uVar14].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
              iVar12 = (int)uVar5;
              if (0 < iVar12) {
                lVar7 = local_60 + (long)(int)uVar20 * 8;
                uVar10 = 0;
                do {
                  dVar22 = *(double *)(lVar7 + uVar10 * 8);
                  if ((dVar22 != pdVar21[uVar10]) || (NAN(dVar22) || NAN(pdVar21[uVar10])))
                  goto LAB_0012d528;
                  uVar10 = uVar10 + 1;
                } while (uVar5 != uVar10);
              }
              lVar7 = (long)(int)(uVar20 + iVar12);
              local_b0 = local_b0 + *(double *)(local_60 + lVar7 * 8);
              local_80 = local_b0;
              uVar18 = (ulong)(uVar20 + local_88);
              piVar16[uVar14] = uVar20 + local_88;
LAB_0012d528:
              iVar2 = (int)uVar18;
              if ((iVar2 < iVar4) && (0 < iVar12)) {
                local_34 = (uint)uVar9;
                lVar7 = local_60 + (long)iVar2 * 8;
                local_e8 = uVar18;
                uVar18 = 0;
                uVar20 = local_84;
                do {
                  dVar22 = *(double *)(lVar7 + uVar18 * 8);
                  dVar23 = pdVar17[uVar18];
                  if (dVar22 < dVar23) {
                    __src = (void *)(local_60 + (long)((int)local_e8 + (int)uVar18) * 8);
                    pdVar17 = (double *)((long)agg + uVar18 * 8);
                    adStack_f8[1] = dVar22;
                    __s[-2] = 0x12d5aa;
                    __s[-1] = 0;
                    memcpy(pdVar17,__src,(ulong)uVar20 * 8 + 8);
                    dVar23 = *pdVar17;
                    uVar5 = local_40;
                    pdVar17 = (double *)agg;
                    dVar22 = adStack_f8[1];
                  }
                  piVar16 = local_58;
                  uVar8 = local_50;
                  lVar3 = local_48;
                  ppiVar15 = local_a8;
                  pvVar19 = local_a0;
                  pdVar21 = local_98;
                  if (dVar23 < dVar22) {
                    uVar9 = (ulong)local_34;
                    goto LAB_0012d613;
                  }
                  uVar18 = uVar18 + 1;
                  uVar20 = uVar20 - 1;
                } while (uVar5 != uVar18);
                uVar9 = CONCAT71((int7)(uVar9 >> 8),1);
              }
              else {
                uVar9 = CONCAT71((int7)((ulong)lVar7 >> 8),iVar2 < iVar4 | (byte)uVar9) & 0xffffffff
                ;
              }
            }
LAB_0012d613:
            local_34 = (uint)uVar9;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar8);
        }
        this_00 = local_e0;
        uVar8 = uVar5;
        pdVar17 = pdVar21;
        if (0 < (int)local_90) {
          do {
            iVar1._M_current = *(double **)(this_00 + 8);
            if (iVar1._M_current == *(double **)(this_00 + 0x10)) {
              __s[-2] = 0x12d671;
              __s[-1] = 0;
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (this_00,iVar1,pdVar17);
              uVar8 = local_40;
            }
            else {
              *iVar1._M_current = *pdVar17;
              *(double **)(this_00 + 8) = iVar1._M_current + 1;
            }
            pdVar17 = pdVar17 + 1;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        pdVar17 = (double *)agg;
        iVar1._M_current = *(double **)(this_00 + 8);
        if (iVar1._M_current == *(double **)(this_00 + 0x10)) {
          __s[-2] = 0x12d6ab;
          __s[-1] = 0;
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (this_00,iVar1,&local_80);
          uVar5 = local_40;
        }
        else {
          *iVar1._M_current = local_80;
          *(double **)(this_00 + 8) = iVar1._M_current + 1;
          uVar5 = uVar8;
        }
        uVar8 = local_50;
        piVar16 = local_58;
        if (0 < (int)uVar5) {
          uVar9 = 0;
          do {
            pdVar21[uVar9] = *(double *)((long)pdVar17 + uVar9 * 8);
            *(undefined8 *)((long)pdVar17 + uVar9 * 8) = 0x7fefffffffffffff;
            uVar9 = uVar9 + 1;
          } while (uVar5 != uVar9);
        }
      } while ((local_34 & 1) != 0);
      local_d0[local_48] = (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 3);
      local_48 = local_48 + 1;
    } while (local_48 != local_c0);
  }
  return;
}

Assistant:

void Fade::mergeCategoricalValues(vector<double>& out, int* outOffsets,
	std::vector<std::vector<double> > const &in, std::vector<int*> const &inOffsets)
{
	int rootID = _dTree->_root->_id;
	int numOfAggGroups = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID];
	int firstCatAggOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + rootID];

	int numOfPartitions = in.size();
        
	double minVal[DEGREE_OF_INTERACTIONS * 2];
	double nextMinVal[DEGREE_OF_INTERACTIONS * 2];

	int pointer[numOfPartitions];
	memset(&pointer[0], 0, sizeof(int) * numOfPartitions);

	for (int aggGroup = 0; aggGroup < numOfAggGroups; ++aggGroup)
	{
		int degreeOfAggGroup = _degreeOfCategoricalAggregateGroup[firstCatAggOffset + aggGroup];

		/* initialize minVal and nextMinVal */
		for (int k = 0; k < degreeOfAggGroup; ++k)
		{
			minVal[k] = in[0][pointer[0] + k];
			nextMinVal[k] = std::numeric_limits<double>::max();
		}

		/* find the minimum value array */
		for (int part = 1; part < numOfPartitions; ++part)
		{
			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				if (in[part][pointer[part] + k] < minVal[k])
				{
					for (int l = k; l < degreeOfAggGroup; ++l)
						minVal[l] = in[part][pointer[part] + l];
				}
				if (in[part][pointer[part] + k] > minVal[k])
					break;
			}
		}

		bool newValue = true;
		while (newValue)
		{
			double agg = 0.0;
			newValue = false;

			bool isMinVal;

			for (int j = 0; j < numOfPartitions; ++j)
			{
				if (pointer[j] < inOffsets[j][aggGroup])
				{
					auto& a = in[j];

				 	isMinVal = true;

					for (int k = 0; k < degreeOfAggGroup; ++k)
					{
                        int x = pointer[j] + k;

						if (a[x] != minVal[k])
						{
							isMinVal = false;
							break;
						}
					}

					if (isMinVal)
					{
						// printf("isMinVal %d  pointer[j] %d  inOff[j][i] %d \n", isMinVal, pointer[j], inOffsets[j][aggGroup]);
					  	agg += a[pointer[j] + degreeOfAggGroup];
						pointer[j] += degreeOfAggGroup + 1;
					}

					isMinVal = false;

					// printf("id: %d d: %d pointer[j]: %d  childAggCounts[d][j][i]: %d \n", nodeID, d, pointer[j], childAggCounts[d][j][i]);
					if (pointer[j] < inOffsets[j][aggGroup])
					{
						isMinVal = true;

						for (int k = 0; k < degreeOfAggGroup; ++k)
						{
							if (a[pointer[j] + k] < nextMinVal[k])
							{
								for (int l = k; l < degreeOfAggGroup; ++l)
								{
									nextMinVal[l] = a[pointer[j] + l];
								}
							}
							if (a[pointer[j] + k] > nextMinVal[k])
							{
								isMinVal = false;
								break;
							}
                            // printf("nextMinVal: %f \n", nextMinVal[k]);
						}
					}
					// printf("isMinVal %d   Degree:  %lu   nodeID: %d \n", isMinVal, d, nodeID);

					if (isMinVal) newValue = true;
				}
			}

            // printf("nextMinVal: ");
            // for (int k = 0; k < degreeOfAggGroup; ++k)
            //     printf("%.2f ", nextMinVal[k]);
            // printf("\n");

			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				// printf("minVal entered:  %f \n", minVal[k]);
				out.push_back(minVal[k]);
			}

			//printf("agg entered:  %f \n", agg);
			out.push_back(agg);

			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				minVal[k] = nextMinVal[k];
				nextMinVal[k] =  std::numeric_limits<double>::max();
			}
		}

		for (int j = 0; j < numOfPartitions; ++j)
			assert(pointer[j] == inOffsets[j][aggGroup]);

		outOffsets[aggGroup] = out.size();
	}

	// printf("outAggregates:  ");	int off = 0;
	// for (size_t i = 0; i < out.size(); ++i) {
	// 	if (i == (size_t) outOffsets[off]) {
	// 		printf(" | "); ++off; }
	// 	printf("%.2f ", out[i]);
	// } printf("\n");
	// printf("outOffsets:  ");
	// for (int i = 0; i < numOfAggGroups; ++i)
	// 	printf("%d ", outOffsets[i]);
	// printf("\n");
}